

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void * randomx::LargePageAllocator::allocMemory(size_t count)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = allocLargePagesMemory(count);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = ::operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* LargePageAllocator::allocMemory(size_t count) {
		void *mem = allocLargePagesMemory(count);
		if (mem == nullptr)
			throw std::bad_alloc();
		return mem;
	}